

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_cost_enc.c
# Opt level: O0

void InsertInterval(CostManager *manager,CostInterval *interval_in,float cost,int position,int start
                   ,int end)

{
  int in_ECX;
  int in_EDX;
  CostManager *in_RSI;
  long in_RDI;
  float in_R8D;
  int in_XMM0_Da;
  CostInterval *interval_new;
  int *local_28;
  
  if (in_ECX < (int)in_R8D) {
    if (*(int *)(in_RDI + 8) < 500) {
      if (*(long *)(in_RDI + 0x8168) == 0) {
        if (*(long *)(in_RDI + 0x8170) == 0) {
          local_28 = (int *)WebPSafeMalloc(CONCAT44(in_XMM0_Da,in_EDX),CONCAT44(in_ECX,in_R8D));
          if (local_28 == (int *)0x0) {
            UpdateCostPerInterval(in_RSI,in_XMM0_Da,in_EDX,in_ECX,in_R8D);
            return;
          }
        }
        else {
          local_28 = *(int **)(in_RDI + 0x8170);
          *(undefined8 *)(in_RDI + 0x8170) = *(undefined8 *)(local_28 + 6);
        }
      }
      else {
        local_28 = *(int **)(in_RDI + 0x8168);
        *(undefined8 *)(in_RDI + 0x8168) = *(undefined8 *)(local_28 + 6);
      }
      *local_28 = in_XMM0_Da;
      local_28[3] = in_EDX;
      local_28[1] = in_ECX;
      local_28[2] = (int)in_R8D;
      PositionOrphanInterval
                (in_RSI,(CostInterval *)CONCAT44(in_XMM0_Da,in_EDX),
                 (CostInterval *)CONCAT44(in_ECX,in_R8D));
      *(int *)(in_RDI + 8) = *(int *)(in_RDI + 8) + 1;
    }
    else {
      UpdateCostPerInterval(in_RSI,in_XMM0_Da,in_EDX,in_ECX,in_R8D);
    }
  }
  return;
}

Assistant:

static WEBP_INLINE void InsertInterval(CostManager* const manager,
                                       CostInterval* const interval_in,
                                       float cost, int position, int start,
                                       int end) {
  CostInterval* interval_new;

  if (start >= end) return;
  if (manager->count_ >= COST_CACHE_INTERVAL_SIZE_MAX) {
    // Serialize the interval if we cannot store it.
    UpdateCostPerInterval(manager, start, end, position, cost);
    return;
  }
  if (manager->free_intervals_ != NULL) {
    interval_new = manager->free_intervals_;
    manager->free_intervals_ = interval_new->next_;
  } else if (manager->recycled_intervals_ != NULL) {
    interval_new = manager->recycled_intervals_;
    manager->recycled_intervals_ = interval_new->next_;
  } else {  // malloc for good
    interval_new = (CostInterval*)WebPSafeMalloc(1, sizeof(*interval_new));
    if (interval_new == NULL) {
      // Write down the interval if we cannot create it.
      UpdateCostPerInterval(manager, start, end, position, cost);
      return;
    }
  }

  interval_new->cost_ = cost;
  interval_new->index_ = position;
  interval_new->start_ = start;
  interval_new->end_ = end;
  PositionOrphanInterval(manager, interval_new, interval_in);

  ++manager->count_;
}